

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uchar * lodepng_chunk_next_const(uchar *chunk,uchar *end)

{
  ulong uVar1;
  byte bVar2;
  
  if (0xb < (ulong)((long)end - (long)chunk) && chunk < end) {
    bVar2 = chunk[1];
    if ((((bVar2 == 0x50 && *chunk == 0x89) && (bVar2 = 0x50, chunk[2] == 'N')) && (chunk[3] == 'G')
        ) && (((chunk[4] == '\r' && (chunk[5] == '\n')) &&
              ((chunk[6] == '\x1a' && (chunk[7] == '\n')))))) {
      return chunk + 8;
    }
    uVar1 = (ulong)((uint)chunk[2] << 8 | (uint)bVar2 << 0x10 | (uint)*chunk << 0x18);
    if (uVar1 + chunk[3] + 0xc <= (ulong)((long)end - (long)chunk)) {
      end = chunk + uVar1 + chunk[3] + 0xc;
    }
  }
  return end;
}

Assistant:

const unsigned char* lodepng_chunk_next_const(const unsigned char* chunk, const unsigned char* end) {
  size_t available_size = (size_t)(end - chunk);
  if(chunk >= end || available_size < 12) return end; /*too small to contain a chunk*/
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    size_t total_chunk_length;
    if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    if(total_chunk_length > available_size) return end; /*outside of range*/
    return chunk + total_chunk_length;
  }
}